

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpBodySyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::UdpBodySyntax,slang::syntax::UdpBodySyntax_const&>
          (BumpAllocator *this,UdpBodySyntax *args)

{
  UdpBodySyntax *pUVar1;
  UdpBodySyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pUVar1 = (UdpBodySyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::UdpBodySyntax::UdpBodySyntax(in_RSI,pUVar1);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }